

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_resetWithMath_Test::~Clone_resetWithMath_Test(Clone_resetWithMath_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, resetWithMath)
{
    auto r = libcellml::Reset::create();
    r->setId("unique");
    r->setOrder(32);
    r->setTestValue(NON_EMPTY_MATH);
    r->setResetValue(EMPTY_MATH);

    auto rClone = r->clone();

    compareReset(r, rClone);
}